

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O0

void vkt::tessellation::anon_unknown_1::initPrograms
               (SourceCollections *programCollection,Flags flags)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  string local_9b0;
  ShaderSource local_990;
  allocator<char> local_961;
  string local_960;
  ostringstream local_940 [8];
  ostringstream src_4;
  string local_7c8;
  ShaderSource local_7a8;
  allocator<char> local_779;
  string local_778;
  ostringstream local_758 [8];
  ostringstream src_3;
  string local_5e0;
  ShaderSource local_5c0;
  allocator<char> local_591;
  string local_590;
  ostringstream local_570 [8];
  ostringstream src_2;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream src_1;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  Flags flags_local;
  SourceCollections *programCollection_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_190,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  std::operator<<(poVar3,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n");
  if ((flags & 1) != 0) {
    std::operator<<((ostream *)local_190,"    gl_PointSize = 2.0;\n");
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vert",&local_1c1);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar4,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_388);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_388,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out mediump vec4 fragColor;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    fragColor = vec4(1.0);\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"frag",&local_3a9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar4,&local_3d8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  bVar1 = isTessellationStage(flags);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_570);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar3 = std::operator<<((ostream *)local_570,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_point_size : require\n");
    poVar3 = std::operator<<(poVar3,"layout(vertices = 1) out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = 3.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = 3.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = 3.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = 3.0;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,
                    "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                   );
    if ((flags & 4) != 0) {
      poVar3 = std::operator<<((ostream *)local_570,"    // pass as is to eval\n");
      std::operator<<(poVar3,
                      "    gl_out[gl_InvocationID].gl_PointSize = gl_in[gl_InvocationID].gl_PointSize;\n"
                     );
    }
    std::operator<<((ostream *)local_570,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"tesc",&local_591);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_590);
    std::__cxx11::ostringstream::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_5c0,&local_5e0);
    glu::ProgramSources::operator<<(pPVar4,&local_5c0);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    std::__cxx11::ostringstream::~ostringstream(local_570);
    std::__cxx11::ostringstream::ostringstream(local_758);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar3 = std::operator<<((ostream *)local_758,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_point_size : require\n");
    poVar3 = std::operator<<(poVar3,"layout(triangles, point_mode) in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    // hide all but one vertex\n");
    poVar3 = std::operator<<(poVar3,"    if (gl_TessCoord.x < 0.99)\n");
    poVar3 = std::operator<<(poVar3,"        gl_Position = vec4(-2.0, 0.0, 0.0, 1.0);\n");
    poVar3 = std::operator<<(poVar3,"    else\n");
    std::operator<<(poVar3,"        gl_Position = gl_in[0].gl_Position;\n");
    if ((flags & 4) == 0) {
      if ((flags & 2) != 0) {
        poVar3 = std::operator<<((ostream *)local_758,"\n");
        poVar3 = std::operator<<(poVar3,"    // set point size\n");
        std::operator<<(poVar3,"    gl_PointSize = 4.0;\n");
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)local_758,"\n");
      poVar3 = std::operator<<(poVar3,"    // add to point size\n");
      std::operator<<(poVar3,"    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n");
    }
    std::operator<<((ostream *)local_758,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"tese",&local_779);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_778);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_7a8,&local_7c8);
    glu::ProgramSources::operator<<(pPVar4,&local_7a8);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::string::~string((string *)&local_778);
    std::allocator<char>::~allocator(&local_779);
    std::__cxx11::ostringstream::~ostringstream(local_758);
  }
  bVar1 = isGeometryStage(flags);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_940);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar3 = std::operator<<((ostream *)local_940,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_geometry_shader : require\n");
    poVar3 = std::operator<<(poVar3,"#extension GL_EXT_geometry_point_size : require\n");
    poVar3 = std::operator<<(poVar3,"layout(points) in;\n");
    poVar3 = std::operator<<(poVar3,"layout(points, max_vertices = 1) out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    std::operator<<(poVar3,"    gl_Position  = gl_in[0].gl_Position;\n");
    if ((flags & 8) == 0) {
      if ((flags & 0x10) != 0) {
        std::operator<<((ostream *)local_940,"    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n");
      }
    }
    else {
      std::operator<<((ostream *)local_940,"    gl_PointSize = 6.0;\n");
    }
    poVar3 = std::operator<<((ostream *)local_940,"\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    std::operator<<(poVar3,"}\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"geom",&local_961);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_960);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_990,&local_9b0);
    glu::ProgramSources::operator<<(pPVar4,&local_990);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_990);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::~string((string *)&local_960);
    std::allocator<char>::~allocator(&local_961);
    std::__cxx11::ostringstream::~ostringstream(local_940);
  }
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const Flags flags)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n";

		if (flags & FLAG_VERTEX_SET)
			src << "    gl_PointSize = 2.0;\n";

		src << "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "layout(location = 0) out mediump vec4 fragColor;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    fragColor = vec4(1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	if (isTessellationStage(flags))
	{
		// Tessellation control shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "#extension GL_EXT_tessellation_point_size : require\n"
				<< "layout(vertices = 1) out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    gl_TessLevelOuter[0] = 3.0;\n"
				<< "    gl_TessLevelOuter[1] = 3.0;\n"
				<< "    gl_TessLevelOuter[2] = 3.0;\n"
				<< "    gl_TessLevelInner[0] = 3.0;\n"
				<< "\n"
				<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n";

			if (flags & FLAG_TESSELLATION_ADD)
				src << "    // pass as is to eval\n"
					<< "    gl_out[gl_InvocationID].gl_PointSize = gl_in[gl_InvocationID].gl_PointSize;\n";

			src << "}\n";

			programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
		}

		// Tessellation evaluation shader
		{
			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n"
				<< "#extension GL_EXT_tessellation_point_size : require\n"
				<< "layout(triangles, point_mode) in;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    // hide all but one vertex\n"
				<< "    if (gl_TessCoord.x < 0.99)\n"
				<< "        gl_Position = vec4(-2.0, 0.0, 0.0, 1.0);\n"
				<< "    else\n"
				<< "        gl_Position = gl_in[0].gl_Position;\n";

			if (flags & FLAG_TESSELLATION_ADD)
				src << "\n"
					<< "    // add to point size\n"
					<< "    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";
			else if (flags & FLAG_TESSELLATION_EVALUATION_SET)
				src << "\n"
					<< "    // set point size\n"
					<< "    gl_PointSize = 4.0;\n";

			src << "}\n";

			programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
		}
	}

	if (isGeometryStage(flags))
	{
		// Geometry shader
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "#extension GL_EXT_geometry_point_size : require\n"
			<< "layout(points) in;\n"
			<< "layout(points, max_vertices = 1) out;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position  = gl_in[0].gl_Position;\n";

		if (flags & FLAG_GEOMETRY_SET)
			src << "    gl_PointSize = 6.0;\n";
		else if (flags & FLAG_GEOMETRY_ADD)
			src << "    gl_PointSize = gl_in[0].gl_PointSize + 2.0;\n";

		src << "\n"
			<< "    EmitVertex();\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}